

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

int __thiscall
icu_63::FieldPosition::clone
          (FieldPosition *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  FieldPosition *this_00;
  undefined8 local_30;
  FieldPosition *this_local;
  
  this_00 = (FieldPosition *)UMemory::operator_new((UMemory *)0x18,(size_t)__fn);
  local_30 = (FieldPosition *)0x0;
  if (this_00 != (FieldPosition *)0x0) {
    FieldPosition(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

FieldPosition *
FieldPosition::clone() const {
    return new FieldPosition(*this);
}